

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O3

void authentication_destroy_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  if (name == (char *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "Failed to destroy authentication option (name is NULL)";
      iVar1 = 0x15d;
LAB_00133d95:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                 ,"authentication_destroy_option",iVar1,1,pcVar2);
      return;
    }
  }
  else if (value == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "Failed to destroy authentication option (value is NULL)";
      iVar1 = 0x161;
      goto LAB_00133d95;
    }
  }
  else {
    iVar1 = strcmp(name,"saved_authentication_options");
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
      return;
    }
  }
  return;
}

Assistant:

static void authentication_destroy_option(const char* name, const void* value)
{
    if (name == NULL)
    {
        LogError("Failed to destroy authentication option (name is NULL)");
    }
    else if (value == NULL)
    {
        LogError("Failed to destroy authentication option (value is NULL)");
    }
    else
    {
        if (strcmp(name, AUTHENTICATION_OPTION_SAVED_OPTIONS) == 0)
        {
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
        }
    }
}